

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::Session::libIdentify(Session *this)

{
  long lVar1;
  
  lVar1 = std::cout;
  *(uint *)(pthread_kill + *(long *)(std::cout + -0x18)) =
       *(uint *)(pthread_kill + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"description: ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"A Catch2 test executable\n",0x19);
  lVar1 = std::cout;
  *(uint *)(pthread_kill + *(long *)(std::cout + -0x18)) =
       *(uint *)(pthread_kill + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"category: ",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"testframework\n",0xe);
  lVar1 = std::cout;
  *(uint *)(pthread_kill + *(long *)(std::cout + -0x18)) =
       *(uint *)(pthread_kill + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"framework: ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Catch Test\n",0xb);
  lVar1 = std::cout;
  *(uint *)(pthread_kill + *(long *)(std::cout + -0x18)) =
       *(uint *)(pthread_kill + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"version: ",9);
  libraryVersion();
  operator<<((ostream *)&std::cout,&libraryVersion::version);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  return;
}

Assistant:

double standard_deviation(std::vector<double>::iterator first, std::vector<double>::iterator last) {
        auto m = Catch::Benchmark::Detail::mean(first, last);
        double variance = std::accumulate(first, last, 0., [m](double a, double b) {
            double diff = b - m;
            return a + diff * diff;
            }) / (last - first);
            return std::sqrt(variance);
    }